

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_print.c
# Opt level: O2

void h262_print_seqparm(h262_seqparm *seqparm)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  
  pcVar2 = "MPEG2";
  if (seqparm->is_ext == 0) {
    pcVar2 = "MPEG1";
  }
  printf("%s sequence header:\n",pcVar2);
  printf("\thorizontal_size = %d\n",(ulong)seqparm->horizontal_size);
  printf("\tvertical_size = %d\n",(ulong)seqparm->vertical_size);
  uVar1 = seqparm->aspect_ratio_information - 1;
  if (uVar1 < 4) {
    pcVar2 = &DAT_00117048 + *(int *)(&DAT_00117048 + (ulong)uVar1 * 4);
  }
  else {
    pcVar2 = "???";
  }
  printf("\taspect_ratio_information = %d [%s]\n",(ulong)seqparm->aspect_ratio_information,pcVar2);
  printf("\tframe_rate_code = %d\n",(ulong)seqparm->frame_rate_code);
  printf("\tbit_rate = %d\n",(ulong)seqparm->bit_rate);
  printf("\tvbv_buffer_size = %d\n",(ulong)seqparm->vbv_buffer_size);
  printf("\tconstrained_parameters_flag = %d\n",(ulong)seqparm->constrained_parameters_flag);
  if (seqparm->load_intra_quantiser_matrix != 0) {
    printf("\tintra_quantiser_matrix =");
    for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 1) {
      printf(" %d",(ulong)seqparm->intra_quantiser_matrix[lVar3]);
    }
    putchar(10);
  }
  if (seqparm->load_non_intra_quantiser_matrix != 0) {
    printf("\tnon_intra_quantiser_matrix =");
    for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 1) {
      printf(" %d",(ulong)seqparm->non_intra_quantiser_matrix[lVar3]);
    }
    putchar(10);
  }
  if (seqparm->is_ext != 0) {
    printf("\tprofile_and_level_indication = 0x%02x\n",(ulong)seqparm->profile_and_level_indication)
    ;
    printf("\tprogressive_sequence = %d\n",(ulong)seqparm->progressive_sequence);
    printf("\tchroma_format = %d\n",(ulong)seqparm->chroma_format);
    printf("\tlow_delay = %d\n",(ulong)seqparm->low_delay);
    printf("\tframe_rate_extension_n = %d\n",(ulong)seqparm->frame_rate_extension_n);
    printf("\tframe_rate_extension_d = %d\n",(ulong)seqparm->frame_rate_extension_d);
    return;
  }
  return;
}

Assistant:

void h262_print_seqparm(struct h262_seqparm *seqparm) {
	int i;
	printf("%s sequence header:\n", seqparm->is_ext?"MPEG2":"MPEG1");
	printf("\thorizontal_size = %d\n", seqparm->horizontal_size);
	printf("\tvertical_size = %d\n", seqparm->vertical_size);
	const char *astr = "???";
	switch (seqparm->aspect_ratio_information) {
		case H262_ASPECT_RATIO_SAMPLE_SQUARE:
			astr = "square sample";
			break;
		case H262_ASPECT_RATIO_DISPLAY_4_3:
			astr = "4:3 display";
			break;
		case H262_ASPECT_RATIO_DISPLAY_16_9:
			astr = "16:9 display";
			break;
		case H262_ASPECT_RATIO_DISPLAY_221_100:
			astr = "2.21:1 display";
			break;
	}
	printf("\taspect_ratio_information = %d [%s]\n", seqparm->aspect_ratio_information, astr);
	printf("\tframe_rate_code = %d\n", seqparm->frame_rate_code);
	printf("\tbit_rate = %d\n", seqparm->bit_rate);
	printf("\tvbv_buffer_size = %d\n", seqparm->vbv_buffer_size);
	printf("\tconstrained_parameters_flag = %d\n", seqparm->constrained_parameters_flag);
	if (seqparm->load_intra_quantiser_matrix) {
		printf("\tintra_quantiser_matrix =");
		for (i = 0; i < 64; i++)
			printf(" %d", seqparm->intra_quantiser_matrix[i]);
		printf("\n");
	}
	if (seqparm->load_non_intra_quantiser_matrix) {
		printf("\tnon_intra_quantiser_matrix =");
		for (i = 0; i < 64; i++)
			printf(" %d", seqparm->non_intra_quantiser_matrix[i]);
		printf("\n");
	}
	if (seqparm->is_ext) {
		printf("\tprofile_and_level_indication = 0x%02x\n", seqparm->profile_and_level_indication);
		printf("\tprogressive_sequence = %d\n", seqparm->progressive_sequence);
		printf("\tchroma_format = %d\n", seqparm->chroma_format);
		printf("\tlow_delay = %d\n", seqparm->low_delay);
		printf("\tframe_rate_extension_n = %d\n", seqparm->frame_rate_extension_n);
		printf("\tframe_rate_extension_d = %d\n", seqparm->frame_rate_extension_d);
	}
}